

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Mapping.c
# Opt level: O2

x86_reg X86_insn_reg_intel(uint id,cs_ac_type *access)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  if (X86_insn_reg_intel_intel_regs_sorted == '\0') {
    memcpy(insn_regs_intel_sorted,insn_regs_intel,0x564);
    qsort(insn_regs_intel_sorted,0x73,0xc,regs_cmp);
    X86_insn_reg_intel_intel_regs_sorted = '\x01';
  }
  if ((insn_regs_intel_sorted[0].insn <= id) && (id <= insn_regs_intel_sorted[0x72].insn)) {
    uVar2 = 0x72;
    uVar3 = 0;
    while (uVar3 <= uVar2) {
      uVar1 = uVar2 + uVar3 >> 1;
      if (insn_regs_intel_sorted[uVar1].insn < id) {
        uVar3 = uVar1 + 1;
      }
      else {
        if (insn_regs_intel_sorted[uVar1].insn == id) {
          if (access != (cs_ac_type *)0x0) {
            *access = insn_regs_intel_sorted[uVar1].access;
          }
          return insn_regs_intel_sorted[uVar1].reg;
        }
        if (uVar2 + uVar3 < 2) {
          return X86_REG_INVALID;
        }
        uVar2 = uVar1 - 1;
      }
    }
  }
  return X86_REG_INVALID;
}

Assistant:

x86_reg X86_insn_reg_intel(unsigned int id, enum cs_ac_type *access)
{
	static bool intel_regs_sorted = false;
	unsigned int first = 0;
	unsigned int last = ARR_SIZE(insn_regs_intel) - 1;
	unsigned int mid;

	if (!intel_regs_sorted) {
		memcpy(insn_regs_intel_sorted, insn_regs_intel,
				sizeof(insn_regs_intel_sorted));
		qsort(insn_regs_intel_sorted,
				ARR_SIZE(insn_regs_intel_sorted),
				sizeof(struct insn_reg), regs_cmp);
		intel_regs_sorted = true;
	}

	if (insn_regs_intel_sorted[0].insn > id ||
			insn_regs_intel_sorted[last].insn < id) {
		return 0;
	}

	while (first <= last) {
		mid = (first + last) / 2;
		if (insn_regs_intel_sorted[mid].insn < id) {
			first = mid + 1;
		} else if (insn_regs_intel_sorted[mid].insn == id) {
			if (access) {
				*access = insn_regs_intel_sorted[mid].access;
			}
			return insn_regs_intel_sorted[mid].reg;
		} else {
			if (mid == 0)
				break;
			last = mid - 1;
		}
	}

	// not found
	return 0;
}